

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::LoadActiveScriptPubKeyMan(CWallet *this,uint256 id,OutputType type,bool internal)

{
  long lVar1;
  ScriptPubKeyMan *pSVar2;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar3;
  string *__str;
  mapped_type *pmVar4;
  mapped_type *ppSVar5;
  iterator iVar6;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_01;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffff78 [11];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = (bool)((byte)((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22) & 1)
  ;
  inline_assertion_check<true,bool>
            ((bool *)&stack0xffffffffffffff83,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0xeef,"LoadActiveScriptPubKeyMan","IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)");
  base_blob<256u>::ToString_abi_cxx11_((string *)&stack0xffffffffffffffa8,(base_blob<256u> *)&id);
  __str = FormatOutputType_abi_cxx11_(type);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88,__str);
  parameters._M_string_length._3_1_ = bVar3;
  parameters._0_11_ = in_stack_ffffffffffffff78;
  parameters._M_string_length._4_4_ = type;
  parameters.field_2 = in_stack_ffffffffffffff88;
  WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,char_const*>
            (this,"Setting spkMan to active: id = %s, type = %s, internal = %s\n",parameters,
             in_stack_ffffffffffffff98,&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  this_01 = &this->m_internal_spk_managers;
  this_00 = &this->m_external_spk_managers;
  if (internal) {
    this_01 = &this->m_external_spk_managers;
    this_00 = &this->m_internal_spk_managers;
  }
  pmVar4 = std::
           map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
           ::at(&this->m_spk_managers,(key_type *)&id);
  pSVar2 = (pmVar4->_M_t).
           super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
           .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl;
  ppSVar5 = std::
            map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
            ::operator[](this_00,(key_type *)&stack0xffffffffffffff84);
  *ppSVar5 = pSVar2;
  iVar6 = std::
          _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
          ::find(&this_01->_M_t,(key_type *)&stack0xffffffffffffff84);
  if (((_Rb_tree_header *)iVar6._M_node != &(this_01->_M_t)._M_impl.super__Rb_tree_header) &&
     ((ScriptPubKeyMan *)iVar6._M_node[1]._M_parent == pSVar2)) {
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
    ::erase(&this_01->_M_t,(key_type *)&stack0xffffffffffffff84);
  }
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&this->NotifyCanGetAddressesChanged);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::LoadActiveScriptPubKeyMan(uint256 id, OutputType type, bool internal)
{
    // Activating ScriptPubKeyManager for a given output and change type is incompatible with legacy wallets.
    // Legacy wallets have only one ScriptPubKeyManager and it's active for all output and change types.
    Assert(IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    WalletLogPrintf("Setting spkMan to active: id = %s, type = %s, internal = %s\n", id.ToString(), FormatOutputType(type), internal ? "true" : "false");
    auto& spk_mans = internal ? m_internal_spk_managers : m_external_spk_managers;
    auto& spk_mans_other = internal ? m_external_spk_managers : m_internal_spk_managers;
    auto spk_man = m_spk_managers.at(id).get();
    spk_mans[type] = spk_man;

    const auto it = spk_mans_other.find(type);
    if (it != spk_mans_other.end() && it->second == spk_man) {
        spk_mans_other.erase(type);
    }

    NotifyCanGetAddressesChanged();
}